

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O2

void __thiscall Editor::openBoard(Editor *this,bool ignoreUnsaved,path *filename)

{
  bool bVar1;
  path *in_RCX;
  undefined7 in_register_00000031;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  format_string_t<ghc::filesystem::path_&> fmt;
  allocator_type local_17e;
  allocator local_17d;
  allocator local_17c;
  allocator local_17b;
  allocator local_17a;
  allocator local_179;
  string local_178;
  file_dialog local_158;
  path openFilename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  openResult;
  undefined1 local_110 [56];
  path local_d8;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  if (((int)CONCAT71(in_register_00000031,ignoreUnsaved) == 0) &&
     (this->lastEditSize_ != this->savedEditSize_)) {
    local_98._8_8_ = 0;
    local_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/Editor.cpp:447:42)>
               ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/Editor.cpp:447:42)>
               ::_M_manager;
    local_98._M_unused._M_object = this;
    EditorInterface::showSaveDialog(&this->interface_,(function<void_()> *)&local_98);
    std::_Function_base::~_Function_base((_Function_base *)&local_98);
    return;
  }
  ghc::filesystem::path::path(&openFilename);
  bVar1 = ghc::filesystem::path::empty(filename);
  if (bVar1) {
    bVar1 = pfd::settings::available();
    if (!bVar1) {
      spdlog::warn<char[113]>
                ((char (*) [113])
                 "Portable File Dialogs is not available on this platform (or a component is missing). Using fallback file dialog."
                );
      ghc::filesystem::path::path<char[7],ghc::filesystem::path>
                ((path *)&local_178,(char (*) [7])"boards",auto_format);
      ghc::filesystem::operator/((path *)&local_98,&this->workingDirectory_,(path *)&local_178);
      EditorInterface::showFileDialog(&this->interface_,true,(path *)&local_98);
      ghc::filesystem::path::~path((path *)&local_98);
      ghc::filesystem::path::~path((path *)&local_178);
      goto LAB_00140411;
    }
    std::__cxx11::string::string((string *)&local_178,"Open",&local_179);
    ghc::filesystem::path::path<char[7],ghc::filesystem::path>
              ((path *)(local_110 + 0x18),(char (*) [7])"boards",auto_format);
    ghc::filesystem::operator/(&local_d8,&this->workingDirectory_,(path *)(local_110 + 0x18));
    ghc::filesystem::path::string_abi_cxx11_(&local_b8,&local_d8);
    std::__cxx11::string::string((string *)local_98._M_pod_data,"Plain Text (*.txt)",&local_17a);
    std::__cxx11::string::string(local_78,"*.txt",&local_17b);
    std::__cxx11::string::string(local_58,"All Files (*.*)",&local_17c);
    std::__cxx11::string::string(local_38,"*",&local_17d);
    __l._M_len = 4;
    __l._M_array = (iterator)&local_98;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_110,__l,&local_17e);
    in_RCX = (path *)local_110;
    pfd::open_file::open_file
              ((open_file *)&local_158,&local_178,&local_b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_RCX,none);
    pfd::internal::file_dialog::vector_result_abi_cxx11_(&openResult,&local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_158.super_dialog.m_async.
                super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_110);
    lVar2 = 0x60;
    do {
      std::__cxx11::string::~string((string *)((long)&local_98 + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    std::__cxx11::string::~string((string *)&local_b8);
    ghc::filesystem::path::~path(&local_d8);
    ghc::filesystem::path::~path((path *)(local_110 + 0x18));
    std::__cxx11::string::~string((string *)&local_178);
    if (openResult.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        openResult.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ghc::filesystem::path::assign<std::__cxx11::string>
                (&openFilename,
                 openResult.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&openResult);
  }
  else {
    ghc::filesystem::path::operator=(&openFilename,filename);
  }
  bVar1 = ghc::filesystem::path::empty(&openFilename);
  if (bVar1) {
    spdlog::info<char[18]>((char (*) [18])"No file selected.");
  }
  else {
    deselectAll(this);
    fmt.str.size_ = (size_t)&openFilename;
    fmt.str.data_ = (char *)0xf;
    spdlog::info<ghc::filesystem::path&>((spdlog *)"Loading \"{}\"...",fmt,in_RCX);
    Board::loadFromFile(this->board_,&openFilename);
    defaultZoom(this);
    std::
    deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
    ::clear(&this->editHistory_);
    this->lastEditSize_ = 0;
    this->savedEditSize_ = 0;
  }
LAB_00140411:
  ghc::filesystem::path::~path(&openFilename);
  return;
}

Assistant:

void Editor::openBoard(bool ignoreUnsaved, const fs::path& filename) {
    if (!ignoreUnsaved && isEditUnsaved()) {
        return interface_.showSaveDialog([this]() {
            openBoard(true);
        });
    }

    fs::path openFilename;
    if (!filename.empty()) {
        openFilename = filename;
    } else if (pfd::settings::available()) {
        auto openResult = pfd::open_file("Open", (workingDirectory_ / "boards").string(), {
            "Plain Text (*.txt)", "*.txt",
            "All Files (*.*)", "*"
        }, pfd::opt::none).result();

        if (!openResult.empty()) {
            openFilename = openResult[0];
        }
    } else {
        spdlog::warn("Portable File Dialogs is not available on this platform (or a component is missing). Using fallback file dialog.");
        return interface_.showFileDialog(true, workingDirectory_ / "boards");
    }

    if (!openFilename.empty()) {
        deselectAll();
        spdlog::info("Loading \"{}\"...", openFilename);
        board_.loadFromFile(openFilename);
        defaultZoom();
        editHistory_.clear();
        lastEditSize_ = 0;
        savedEditSize_ = 0;
    } else {
        spdlog::info("No file selected.");
    }
}